

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O0

uo_cb * uo_cb_create(void)

{
  uo_cb_linklist *puVar1;
  uo_cb *cb;
  
  puVar1 = uo_cb_linkpool_rent();
  uo_stack_create_at(&(puVar1->item).stack,0);
  uo__linklist_selflink(&(puVar1->item).funclist);
  return &puVar1->item;
}

Assistant:

uo_cb *uo_cb_create()
{
    uo_cb *cb = &uo_cb_linkpool_rent()->item;
    uo_stack_create_at(&cb->stack, 0);
    uo_linklist_selflink(&cb->funclist);

    return cb;
}